

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  size_type this_00;
  undefined8 uVar2;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  cmListFileContext local_98;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long local_38;
  
  paVar1 = &local_98.FilePath.field_2;
  local_98.FilePath._M_string_length = 0;
  local_98.FilePath.field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  local_48 = 0;
  local_38 = 0;
  __s = this->FileName;
  local_98.FilePath._M_dataplus._M_p = (pointer)paVar1;
  local_98.Line = (long)&local_48;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_98.Line,0,(char *)0x0,(ulong)__s);
  local_38 = cmListFileLexer_GetCurrentLine(this->Lexer);
  local_98.Name._M_dataplus._M_p =
       (pointer)(this->Backtrace).TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_98.Name._M_string_length =
       (size_type)
       (this->Backtrace).TopEntry.
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length)->_M_use_count
           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length)->
             _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length)->_M_use_count
           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length)->
             _M_use_count + 1;
    }
  }
  cmListFileBacktrace::Push((cmListFileBacktrace *)&local_98.Name.field_2,&local_98);
  uVar2 = local_98.Name.field_2._8_8_;
  local_98.Name._M_dataplus._M_p = (pointer)local_98.Name.field_2._M_allocated_capacity;
  this_00 = local_98.Name._M_string_length;
  local_98.Name.field_2._M_allocated_capacity = 0;
  local_98.Name.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.Name._M_string_length = uVar2;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name.field_2._8_8_);
  }
  cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,text,(cmListFileBacktrace *)&local_98);
  cmSystemTools::s_FatalErrorOccured = true;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.Name._M_string_length);
  }
  if ((undefined1 *)local_98.Line != &local_48) {
    operator_delete((void *)local_98.Line,CONCAT71(uStack_47,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.FilePath._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.FilePath._M_dataplus._M_p,
                    CONCAT71(local_98.FilePath.field_2._M_allocated_capacity._1_7_,
                             local_98.FilePath.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccured();
}